

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

int doMain(int startArgumentIndex,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  sysbvm_context_t *psVar3;
  bool bVar4;
  int iVar5;
  sysbvm_tuple_t sVar6;
  size_t sVar7;
  sysbvm_tuple_t sVar8;
  sysbvm_tuple_t language;
  char *pcVar9;
  int iVar10;
  size_t i;
  size_t sVar11;
  bool bVar12;
  anon_struct_72_9_3b666fec gcFrame;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *local_40;
  
  local_40 = &local_a8;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = 0;
  sStack_a0 = 0;
  local_68 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 9;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_a8 = sysbvm_orderedCollection_create(context);
  sStack_a0 = sysbvm_orderedCollection_create(context);
  local_88 = sysbvm_orderedCollection_create(context);
  bVar4 = false;
  bVar12 = false;
  bVar2 = false;
  bVar1 = false;
  do {
    sVar8 = sStack_a0;
    psVar3 = context;
    if (argc <= startArgumentIndex) {
      if (bVar1 || bVar2) {
        local_68 = sysbvm_orderedCollection_create(context);
        sVar7 = sysbvm_orderedCollection_getSize(local_a8);
        for (sVar11 = 0; sVar7 != sVar11; sVar11 = sVar11 + 1) {
          local_98 = sysbvm_orderedCollection_at(local_a8,sVar11);
          local_98 = sysbvm_filesystem_absolute(context,local_98);
          sStack_80 = sysbvm_interpreter_loadSourceCodeWithSolvedPath(context,local_98);
          local_78 = sysbvm_scanner_scan(context,sStack_80);
          if (bVar1) {
            sysbvm_orderedCollection_add(context,local_68,local_78);
          }
          if (!bVar1 || bVar2) {
            sStack_70 = sysbvm_parser_parseTokens(context,sStack_80,local_78);
            sysbvm_orderedCollection_add(context,local_68,sStack_70);
          }
        }
      }
      else {
        sVar7 = sysbvm_orderedCollection_getSize(local_a8);
        for (sVar11 = 0; psVar3 = context, sVar7 != sVar11; sVar11 = sVar11 + 1) {
          local_98 = sysbvm_orderedCollection_at(local_a8,sVar11);
          local_98 = sysbvm_filesystem_absolute(context,local_98);
          sysbvm_interpreter_loadSourceNamedWithSolvedPath(context,local_98);
        }
        sVar8 = sysbvm_analysisQueue_getDefault(context);
        sysbvm_analysisQueue_waitPendingAnalysis(psVar3,sVar8);
        sVar7 = sysbvm_orderedCollection_getSize(local_88);
        for (sVar11 = 0; psVar3 = context, sVar7 != sVar11; sVar11 = sVar11 + 1) {
          sVar8 = sysbvm_orderedCollection_at(local_88,sVar11);
          psVar3 = context;
          local_88 = sVar8;
          sVar6 = sysbvm_string_createWithCString(context,"commandLine");
          language = sysbvm_symbol_internWithCString(context,"sysmel");
          sysbvm_interpreter_evaluateScript(psVar3,sVar8,sVar6,language);
        }
        sVar8 = sysbvm_analysisQueue_getDefault(context);
        sysbvm_analysisQueue_waitPendingAnalysis(psVar3,sVar8);
      }
      if (bVar4) {
        sysbvm_context_printMemoryUsageStats(context);
      }
      sysbvm_stackFrame_popRecord(&local_58);
      return 0;
    }
    pcVar9 = argv[startArgumentIndex];
    iVar10 = startArgumentIndex;
    if (bVar12) {
      sVar6 = sysbvm_string_createWithCString(context,pcVar9);
      sysbvm_orderedCollection_add(psVar3,sVar8,sVar6);
      bVar12 = true;
    }
    else {
      if (*pcVar9 == '-') {
        iVar5 = strcmp(pcVar9,"-help");
        if (iVar5 == 0) {
          pcVar9 = "sysbvm-lispi <inputfile> <inputfile> -- args";
LAB_00102842:
          puts(pcVar9);
          return 0;
        }
        iVar5 = strcmp(pcVar9,"-version");
        if (iVar5 == 0) {
          pcVar9 = "sysbvm-lispi version 0.1";
          goto LAB_00102842;
        }
        iVar5 = strcmp(pcVar9,"-save-image");
        if (iVar5 == 0) {
          iVar10 = startArgumentIndex + 1;
          destinationImageFilename = argv[(long)startArgumentIndex + 1];
        }
        else {
          iVar5 = strcmp(pcVar9,"-scan-only");
          if (iVar5 == 0) {
            bVar1 = true;
          }
          else {
            iVar5 = strcmp(pcVar9,"-parse-only");
            if (iVar5 == 0) {
              bVar2 = true;
            }
            else {
              iVar5 = strcmp(pcVar9,"-print-stats");
              if (iVar5 == 0) {
                bVar4 = true;
              }
              else {
                if ((pcVar9[1] == 'e') && (pcVar9[2] == '\0')) {
                  sVar6 = sysbvm_string_createWithCString
                                    (context,argv[(long)startArgumentIndex + 1]);
                  sVar8 = local_88;
                  startArgumentIndex = startArgumentIndex + 1;
                  sStack_90 = sVar6;
                  goto LAB_001025d8;
                }
                if (pcVar9[1] == '-') {
                  bVar12 = pcVar9[2] == '\0';
                  goto LAB_00102608;
                }
              }
            }
          }
        }
      }
      else {
        sVar6 = sysbvm_string_createWithCString(context,pcVar9);
        sVar8 = local_a8;
        local_98 = sVar6;
LAB_001025d8:
        sysbvm_orderedCollection_add(context,sVar8,sVar6);
        iVar10 = startArgumentIndex;
      }
      bVar12 = false;
    }
LAB_00102608:
    startArgumentIndex = iVar10 + 1;
  } while( true );
}

Assistant:

int doMain(int startArgumentIndex, int argc, const char *argv[])
{
    bool scanOnly = false;
    bool parseOnly = false;
    bool printStats = false;
    struct {
        sysbvm_tuple_t filesToProcess;
        sysbvm_tuple_t remainingArgs;
        sysbvm_tuple_t inputFileName;
        sysbvm_tuple_t inlineScriptToRun;
        sysbvm_tuple_t inlineScriptsToRun;
        sysbvm_tuple_t sourceCode;
        sysbvm_tuple_t scanResult;
        sysbvm_tuple_t parseResult;
        sysbvm_tuple_t parseScanResults;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    // Parse the command line.
    gcFrame.filesToProcess = sysbvm_orderedCollection_create(context);
    gcFrame.remainingArgs = sysbvm_orderedCollection_create(context);
    gcFrame.inlineScriptsToRun = sysbvm_orderedCollection_create(context);
    bool isParsingRemainingArgs = false;
    for(int i = startArgumentIndex; i < argc; ++i)
    {
        const char *arg = argv[i];
        if(isParsingRemainingArgs)
        {
            sysbvm_orderedCollection_add(context, gcFrame.remainingArgs, sysbvm_string_createWithCString(context, arg));
            continue;
        }
        
        if(*arg == '-')
        {
            if(!strcmp(arg, "-help"))
            {
                printHelp();
                return 0;
            }
            else if(!strcmp(arg, "-version"))
            {
                printVersion();
                return 0;
            }
            else if(!strcmp(arg, "-save-image"))
            {
                arg = argv[++i];
                destinationImageFilename = arg;
            }
            else if(!strcmp(arg, "-scan-only"))
            {
                scanOnly = true;
            }
            else if(!strcmp(arg, "-parse-only"))
            {
                parseOnly = true;
            }
            else if(!strcmp(arg, "-print-stats"))
            {
                printStats = true;
            }
            else if(!strcmp(arg, "-e"))
            {
                arg = argv[++i];
                gcFrame.inlineScriptToRun = sysbvm_string_createWithCString(context, arg);
                sysbvm_orderedCollection_add(context, gcFrame.inlineScriptsToRun, gcFrame.inlineScriptToRun);
            }
            else if(!strcmp(arg, "--"))
            {
                isParsingRemainingArgs = true;
            }
            else if(!strcmp(argv[i], "-m32") ||
                !strcmp(argv[i], "-m64") ||
                !strcmp(argv[i], "-nojit") ||
                !strcmp(argv[i], "-nogc")
            )
            {
                // These options are parsed before the context creation.
            }
        }
        else
        {
            gcFrame.inputFileName = sysbvm_string_createWithCString(context, arg);
            sysbvm_orderedCollection_add(context, gcFrame.filesToProcess, gcFrame.inputFileName);
        }
    }

    if(scanOnly || parseOnly)
    {
        gcFrame.parseScanResults = sysbvm_orderedCollection_create(context);
        {
            size_t inputFileSize = sysbvm_orderedCollection_getSize(gcFrame.filesToProcess);
            for(size_t i = 0; i < inputFileSize; ++i)
            {
                gcFrame.inputFileName = sysbvm_orderedCollection_at(gcFrame.filesToProcess, i);
                gcFrame.inputFileName = sysbvm_filesystem_absolute(context, gcFrame.inputFileName);
                gcFrame.sourceCode = sysbvm_interpreter_loadSourceCodeWithSolvedPath(context, gcFrame.inputFileName);
                gcFrame.scanResult = sysbvm_scanner_scan(context, gcFrame.sourceCode);
                if(scanOnly)
                    sysbvm_orderedCollection_add(context, gcFrame.parseScanResults, gcFrame.scanResult);

                if(parseOnly)
                {
                    gcFrame.parseResult = sysbvm_parser_parseTokens(context, gcFrame.sourceCode, gcFrame.scanResult);
                    sysbvm_orderedCollection_add(context, gcFrame.parseScanResults, gcFrame.parseResult);
                }
            }

        }
    }
    else
    {
        {
            size_t inputFileSize = sysbvm_orderedCollection_getSize(gcFrame.filesToProcess);
            for(size_t i = 0; i < inputFileSize; ++i)
            {
                gcFrame.inputFileName = sysbvm_orderedCollection_at(gcFrame.filesToProcess, i);
                gcFrame.inputFileName = sysbvm_filesystem_absolute(context, gcFrame.inputFileName);
                sysbvm_interpreter_loadSourceNamedWithSolvedPath(context, gcFrame.inputFileName);
            }

            sysbvm_analysisQueue_waitPendingAnalysis(context, sysbvm_analysisQueue_getDefault(context));
        }

        {
            size_t inlineScriptToRunCount = sysbvm_orderedCollection_getSize(gcFrame.inlineScriptsToRun);
            for(size_t i = 0; i < inlineScriptToRunCount; ++i)
            {
                gcFrame.inlineScriptsToRun = sysbvm_orderedCollection_at(gcFrame.inlineScriptsToRun, i);
                sysbvm_interpreter_evaluateScript(context, gcFrame.inlineScriptsToRun, sysbvm_string_createWithCString(context, "commandLine"), sysbvm_symbol_internWithCString(context, "sysmel"));
            }

            sysbvm_analysisQueue_waitPendingAnalysis(context, sysbvm_analysisQueue_getDefault(context));
        }
    }

    if(printStats)
        sysbvm_context_printMemoryUsageStats(context);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return 0;
}